

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cortex_socket.cpp
# Opt level: O0

int ConvertToIPAddress(char *szNameOrAddress,in_addr *Address)

{
  int iVar1;
  in_addr_t iVar2;
  hostent *phVar3;
  undefined4 *in_RSI;
  char *in_RDI;
  unsigned_long addr;
  hostent *haddr;
  ulong local_28 [2];
  undefined4 *local_18;
  char *local_10;
  int local_4;
  
  local_28[1] = 0;
  if ((in_RDI == (char *)0x0) || (*in_RDI == '\0')) {
    *in_RSI = 0xffffffff;
    local_4 = 0;
  }
  else {
    local_18 = in_RSI;
    local_10 = in_RDI;
    iVar1 = isalpha((int)*in_RDI);
    if (iVar1 == 0) {
      iVar2 = inet_addr(local_10);
      local_28[0] = (ulong)iVar2;
      phVar3 = gethostbyaddr(local_28,4,2);
      if (phVar3 == (hostent *)0x0) {
        local_4 = -1;
      }
      else {
        *local_18 = (int)local_28[0];
        local_4 = 0;
      }
    }
    else {
      phVar3 = gethostbyname(local_10);
      if (phVar3 == (hostent *)0x0) {
        local_4 = -1;
      }
      else if (phVar3->h_length == 4) {
        *local_18 = *(undefined4 *)*phVar3->h_addr_list;
        local_4 = 0;
      }
      else {
        local_4 = -1;
      }
    }
  }
  return local_4;
}

Assistant:

int ConvertToIPAddress(const char *szNameOrAddress, struct in_addr *Address)
{
  struct hostent* haddr = NULL;
  //    char s[256];

  if (szNameOrAddress == NULL || szNameOrAddress[0] == 0) {
    Address->s_addr = INADDR_BROADCAST;
    return 0;
  }

  /* find Internet address of host */

  if (!isalpha(szNameOrAddress[0])) {
    /* Convert a.b.c.d address to a usable one */
    unsigned long addr = inet_addr(szNameOrAddress);
    haddr = gethostbyaddr((char *) &addr, 4, AF_INET);
    if (haddr != NULL) {
      Address->s_addr = addr;
      return 0;
    }
    return -1;
  }

  /* server address is a name */
  haddr = gethostbyname(szNameOrAddress);

  if (haddr == NULL) {
    return -1;
  }

  if (haddr->h_length != sizeof(in_addr)) {
    //        LOGMESSAGE("SOCKET ERROR: address sizes don't match?!");
    return -1;
  }

  memcpy(
      Address,
      haddr->h_addr_list[0],
      sizeof(in_addr));

  return 0;
}